

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

bool_t btokCVCNameIsValid(char *name)

{
  bool_t bVar1;
  size_t sVar2;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar3;
  
  bVar1 = strIsValid((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar3 = false;
  if (bVar1 != 0) {
    sVar2 = strLen((char *)0x15047a);
    bVar3 = false;
    if (7 < sVar2) {
      sVar2 = strLen((char *)0x150497);
      bVar3 = false;
      if (sVar2 < 0xd) {
        bVar1 = strIsPrintable(in_stack_ffffffffffffffe8);
        bVar3 = bVar1 != 0;
      }
    }
  }
  return (bool_t)bVar3;
}

Assistant:

static bool_t btokCVCNameIsValid(const char* name)
{
	return strIsValid(name) &&
		8 <= strLen(name) && strLen(name) <= 12 &&
		strIsPrintable(name);
}